

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>,false>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar2;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<unsigned_short,_(unsigned_char)__b_> local_28;
  undefined8 local_10;
  
  SVar2 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  local_10 = SVar2.v._8_8_;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_28.v[lVar1] = (ushort)*(byte *)((long)&local_10 + lVar1);
  }
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}